

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::getToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  pointer pcVar1;
  ifstream *piVar2;
  _Map_pointer ppiVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  long *plVar14;
  _Elt_pointer piVar15;
  ostream *poVar17;
  bool bVar18;
  int iVar19;
  char cVar20;
  uint uVar21;
  _Elt_pointer piVar22;
  char c;
  string str;
  Token token;
  byte local_1d5;
  int local_1d4;
  undefined1 local_1d0 [17];
  undefined7 uStack_1bf;
  _Elt_pointer local_1a0;
  _Elt_pointer local_198;
  _Elt_pointer local_190;
  _Map_pointer local_188;
  undefined1 local_180 [80];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  ulong uVar16;
  
  if (this->ungottenToken == true) {
    this->ungottenToken = false;
    (__return_storage_ptr__->_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_name).field_2;
    pcVar1 = (this->lastToken)._name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->lastToken)._name._M_string_length);
    (__return_storage_ptr__->_relOp)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_relOp).field_2;
    pcVar1 = (this->lastToken)._relOp._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->_relOp,pcVar1,
               pcVar1 + (this->lastToken)._relOp._M_string_length);
    bVar18 = (this->lastToken)._eol;
    bVar6 = (this->lastToken)._ind;
    bVar7 = (this->lastToken)._ded;
    bVar8 = (this->lastToken)._isWholeNumber;
    bVar9 = (this->lastToken)._isString;
    cVar20 = (this->lastToken)._symbol;
    uVar10 = (this->lastToken).field_0x47;
    dVar5 = (this->lastToken)._wholeNumber;
    __return_storage_ptr__->_eof = (this->lastToken)._eof;
    __return_storage_ptr__->_eol = bVar18;
    __return_storage_ptr__->_ind = bVar6;
    __return_storage_ptr__->_ded = bVar7;
    __return_storage_ptr__->_isWholeNumber = bVar8;
    __return_storage_ptr__->_isString = bVar9;
    __return_storage_ptr__->_symbol = cVar20;
    __return_storage_ptr__->field_0x47 = uVar10;
    __return_storage_ptr__->_wholeNumber = dVar5;
    (__return_storage_ptr__->_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_string).field_2;
    pcVar1 = (this->lastToken)._string._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->_string,pcVar1,
               pcVar1 + (this->lastToken)._string._M_string_length);
    return __return_storage_ptr__;
  }
  local_1d4 = 0;
  plVar14 = (long *)std::istream::get((char *)this->inStream);
  iVar19 = 0;
  if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) == 0) {
    iVar19 = 0;
    do {
      iVar12 = isspace((int)(char)local_1d5);
      if (((char)local_1d5 == 10) || (iVar12 == 0)) break;
      iVar19 = iVar19 + 1;
      local_1d4 = iVar19;
      plVar14 = (long *)std::istream::get((char *)this->inStream);
    } while ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) == 0);
  }
  if (local_1d5 == 0x23) {
    do {
      plVar14 = (long *)std::istream::get((char *)this->inStream);
    } while ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) == 0);
  }
  if (((byte)this->inStream[*(long *)(*(long *)this->inStream + -0x18) + 0x20] & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Error while reading the input stream in Tokenizer.\n");
    goto LAB_0011336d;
  }
  Token::Token((Token *)local_180);
  piVar2 = this->inStream;
  bVar11 = local_180[0x46];
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 2) != 0) {
    ppiVar3 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 2) +
        ((long)(this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)ppiVar3 -
                  (long)(this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppiVar3 == (_Map_pointer)0x0)) * 0x80 < 2) {
      local_180[0x40] = true;
    }
    else {
      std::deque<int,_std::allocator<int>_>::pop_back(&(this->indents).c);
      local_180[0x43] = true;
      std::istream::unget();
      bVar11 = local_180[0x46];
    }
    goto LAB_00113195;
  }
  if (this->parsingANewLine == true) {
    this_00 = &this->indents;
    piVar22 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (piVar22 ==
        (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      iVar12 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1][0x7f];
    }
    else {
      iVar12 = piVar22[-1];
    }
    if (iVar19 != iVar12) {
      if (iVar12 < iVar19) {
        std::istream::unget();
        local_180._72_8_ = (undefined8)iVar19;
        local_180[0x42] = true;
        piVar4 = (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (piVar4 == (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)this_00,&local_1d4);
          bVar11 = local_180[0x46];
        }
        else {
          *piVar4 = iVar19;
          (this->indents).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = piVar4 + 1;
          bVar11 = local_180[0x46];
        }
      }
      else if (iVar19 < iVar12) {
        std::deque<int,_std::allocator<int>_>::deque
                  ((deque<int,_std::allocator<int>_> *)local_1d0,&this_00->c);
        piVar15 = (_Elt_pointer)CONCAT71(uStack_1bf,local_1d0[0x10]);
        piVar22 = local_198;
        if (local_1a0 != piVar15) {
          do {
            if (local_1a0 == piVar22) {
              if (iVar19 == local_188[-1][0x7f]) {
LAB_00112efb:
                std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
                local_180[0x43] = true;
                if (-1 < iVar19) {
                  iVar19 = iVar19 + 1;
                  do {
                    std::istream::unget();
                    iVar19 = iVar19 + -1;
                  } while (0 < iVar19);
                }
                std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                          ((_Deque_base<int,_std::allocator<int>_> *)local_1d0);
                bVar11 = local_180[0x46];
                goto LAB_00113195;
              }
              operator_delete(piVar22,0x200);
              piVar15 = (_Elt_pointer)CONCAT71(uStack_1bf,local_1d0[0x10]);
              piVar22 = local_188[-1];
              local_190 = piVar22 + 0x80;
              local_1a0 = piVar22 + 0x7f;
              local_198 = piVar22;
              local_188 = local_188 + -1;
            }
            else {
              if (iVar19 == local_1a0[-1]) goto LAB_00112efb;
              local_1a0 = local_1a0 + -1;
            }
          } while (local_1a0 != piVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BAD DEDENT: ",0xc)
        ;
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar19);
        std::operator<<(poVar17," spaces.\n");
        goto LAB_0011336d;
      }
      goto LAB_00113195;
    }
  }
  uVar21 = (uint)(char)local_1d5;
  if (uVar21 == 10) {
    local_180[0x41] = true;
    goto LAB_00113195;
  }
  cVar20 = (char)piVar2;
  if (uVar21 - 0x30 < 10) {
    std::istream::putback(cVar20);
    local_180._72_8_ = readInteger(this);
    local_180[0x44] = true;
    bVar11 = local_180[0x46];
    goto LAB_00113195;
  }
  if (local_1d5 < 0x3c) {
    if (local_1d5 == 0x21) {
      std::istream::putback(cVar20);
      readRelOp_abi_cxx11_(&local_b0,this);
      Token::setOp((Token *)local_180,&local_b0);
      local_90.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
      local_90._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      bVar11 = local_180[0x46];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00113195;
    }
    else if (local_1d5 == 0x22) {
      local_1d0._8_8_ = 0;
      local_1d0[0x10] = 0;
      local_1d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1d0 + 0x10);
      while( true ) {
        iVar19 = std::istream::peek();
        if (iVar19 == 0x22) break;
        std::istream::get((char *)this->inStream);
        std::__cxx11::string::push_back((char)local_1d0);
      }
      std::istream::get((char *)this->inStream);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_1d0._0_8_,
                 (undefined1 *)(local_1d0._8_8_ + local_1d0._0_8_));
      std::__cxx11::string::operator=((string *)&local_130,(string *)local_50);
      local_180[0x45] = true;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      bVar11 = local_180[0x46];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1d0 + 0x10)) goto LAB_00113195;
LAB_00113103:
      local_90.field_2._M_allocated_capacity = CONCAT71(uStack_1bf,local_1d0[0x10]);
      local_90._M_dataplus._M_p = (pointer)local_1d0._0_8_;
    }
    else {
      if (local_1d5 == 0x2f) {
        iVar19 = std::istream::peek();
        uVar21 = 0x2f;
        if (iVar19 == 0x2f) {
          local_1d0._8_8_ = 0;
          local_1d0[0x10] = 0;
          local_1d0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1d0 + 0x10);
          std::__cxx11::string::push_back((char)local_1d0);
          std::istream::get((char *)this->inStream);
          std::__cxx11::string::push_back((char)local_1d0);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_1d0._0_8_,
                     (undefined1 *)(local_1d0._8_8_ + local_1d0._0_8_));
          Token::setOp((Token *)local_180,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          bVar11 = local_180[0x46];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1d0 + 0x10)) goto LAB_00113195;
          goto LAB_00113103;
        }
      }
LAB_00113119:
      uVar13 = uVar21 & 0xff;
      uVar16 = (ulong)uVar13;
      bVar11 = (byte)uVar21;
      if (bVar11 < 0x3c) {
        if ((0xac2000000000U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_00113195;
        if (uVar16 == 0x3a) {
          local_180[0x46] = 0x3a;
          bVar11 = local_180[0x46];
          goto LAB_00113195;
        }
        if (uVar16 == 0x3b) {
          local_180[0x46] = 0x3b;
          bVar11 = local_180[0x46];
          goto LAB_00113195;
        }
      }
      if ((bVar11 & 0xfe) == 0x28) goto LAB_00113195;
      if (uVar13 < 0x5d) {
        if (uVar13 == 0x2c) {
          local_180[0x46] = 0x2c;
          bVar11 = local_180[0x46];
          goto LAB_00113195;
        }
        if (uVar13 == 0x2e) {
          local_180[0x46] = 0x2e;
          bVar11 = local_180[0x46];
          goto LAB_00113195;
        }
        if (uVar13 == 0x5b) goto LAB_00113195;
      }
      else if (((uVar13 == 0x5d) || (uVar13 == 0x7d)) || (uVar13 == 0x7b)) goto LAB_00113195;
      iVar19 = isalpha((int)(char)local_1d5);
      if (iVar19 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unknown character in input. ->",0x1e);
        local_1d0[0] = local_1d5;
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_1d0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<-",2);
        std::endl<char,std::char_traits<char>>(poVar17);
LAB_0011336d:
        exit(1);
      }
      std::istream::putback((char)this->inStream);
      readName_abi_cxx11_(&local_f0,this);
      std::__cxx11::string::_M_assign((string *)local_180);
      local_90.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
      local_90._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      bVar11 = local_180[0x46];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_00113195;
    }
  }
  else if (local_1d5 == 0x3c) {
    std::istream::putback(cVar20);
    readRelOp_abi_cxx11_(&local_90,this);
    Token::setOp((Token *)local_180,&local_90);
    bVar11 = local_180[0x46];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00113195;
  }
  else if (local_1d5 == 0x3d) {
    iVar19 = std::istream::peek();
    if (iVar19 != 0x3d) {
      local_180[0x46] = local_1d5;
      bVar11 = local_180[0x46];
      goto LAB_00113195;
    }
    std::istream::putback((char)this->inStream);
    readRelOp_abi_cxx11_(&local_d0,this);
    Token::setOp((Token *)local_180,&local_d0);
    local_90.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_d0._M_dataplus._M_p;
    bVar11 = local_180[0x46];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_00113195;
  }
  else {
    if (local_1d5 != 0x3e) goto LAB_00113119;
    std::istream::putback(cVar20);
    readRelOp_abi_cxx11_(&local_70,this);
    Token::setOp((Token *)local_180,&local_70);
    local_90.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_70._M_dataplus._M_p;
    bVar11 = local_180[0x46];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00113195;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  bVar11 = local_180[0x46];
LAB_00113195:
  local_180[0x46] = bVar11;
  bVar18 = true;
  if (local_180[0x41] == false) {
    bVar18 = local_180[0x43];
  }
  this->parsingANewLine = bVar18;
  std::vector<Token,_std::allocator<Token>_>::push_back(&this->_tokens,(value_type *)local_180);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&(this->lastToken)._relOp);
  (this->lastToken)._eof = local_180[0x40];
  (this->lastToken)._eol = local_180[0x41];
  (this->lastToken)._ind = local_180[0x42];
  (this->lastToken)._ded = local_180[0x43];
  (this->lastToken)._isWholeNumber = local_180[0x44];
  (this->lastToken)._isString = local_180[0x45];
  (this->lastToken)._symbol = local_180[0x46];
  (this->lastToken).field_0x47 = local_180[0x47];
  (this->lastToken)._wholeNumber = (double)local_180._72_8_;
  std::__cxx11::string::_M_assign((string *)&(this->lastToken)._string);
  (__return_storage_ptr__->_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_name).field_2;
  pcVar1 = (this->lastToken)._name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->lastToken)._name._M_string_length);
  (__return_storage_ptr__->_relOp)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_relOp).field_2;
  pcVar1 = (this->lastToken)._relOp._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->_relOp,pcVar1,
             pcVar1 + (this->lastToken)._relOp._M_string_length);
  bVar18 = (this->lastToken)._eol;
  bVar6 = (this->lastToken)._ind;
  bVar7 = (this->lastToken)._ded;
  bVar8 = (this->lastToken)._isWholeNumber;
  bVar9 = (this->lastToken)._isString;
  cVar20 = (this->lastToken)._symbol;
  uVar10 = (this->lastToken).field_0x47;
  dVar5 = (this->lastToken)._wholeNumber;
  __return_storage_ptr__->_eof = (this->lastToken)._eof;
  __return_storage_ptr__->_eol = bVar18;
  __return_storage_ptr__->_ind = bVar6;
  __return_storage_ptr__->_ded = bVar7;
  __return_storage_ptr__->_isWholeNumber = bVar8;
  __return_storage_ptr__->_isString = bVar9;
  __return_storage_ptr__->_symbol = cVar20;
  __return_storage_ptr__->field_0x47 = uVar10;
  __return_storage_ptr__->_wholeNumber = dVar5;
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  pcVar1 = (this->lastToken)._string._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->_string,pcVar1,
             pcVar1 + (this->lastToken)._string._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x30) {
    operator_delete((void *)local_180._32_8_,local_180._48_8_ + 1);
  }
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getToken() {

    if (ungottenToken) {
        ungottenToken = false;
        return lastToken;
    }

    char c;
    int spaces = 0;
    while( inStream.get(c) && isspace(c) && c != '\n' )  // Skip spaces but not new-line chars.
        spaces++;

    if (c == '#') while (inStream.get(c) && c != '\n');  // Skip spaces and new-line chars.;

    if(inStream.bad()) {
        std::cout << "Error while reading the input stream in Tokenizer.\n";
        exit(1);
    }


    Token token;

    if (inStream.eof()) {
        if(indents.size() > 1){
            indents.pop();
            token.isDedent() = true;
            inStream.unget();
        } else token.eof() = true;
    } else if(parsingANewLine && spaces != indents.top()){ //Indent Handling
        if (spaces > indents.top()) {
            inStream.unget();
            token.setIndent(spaces);
            indents.push(spaces);
        } else if (spaces < indents.top()) {
            std::stack<int>indentsCopy = indents;
            while(!indentsCopy.empty()){
                if(spaces == indentsCopy.top())
                    break;
                indentsCopy.pop();
            }
            if(indentsCopy.empty()){
                std::cout << "BAD DEDENT: " << spaces << " spaces.\n";
                exit(1);
            } else {
                indents.pop();
                token.isDedent() = true;
                for (int i = spaces; i >= 0; i--)
                    inStream.unget();
            }
        }
    }
//    else if (spaces > indents.top() && parsingANewLine) {
//        indents.push(spaces);
//        inStream.putback(c);
//        token.isIndent() = true;
//        parsingANewLine = false;
//    } else if (spaces < indents.top() && parsingANewLine && c != '\n') {
//        while (!indents.empty()) {
//            indents.pop();
//            dedents++;
//            if(indents.top() == spaces)
//                break;
//
//        }
//        if (indents.empty()) {
//            std::cout << "Indentation error..." << std::endl;
//            exit(2);
//        }
//        inStream.putback(c);
//        token.isDedent() = true;
//        parsingANewLine = false;
//    }
    else if (c == '\n') {  // will not ever be the case unless new-line characters are not supressed.
        //parsingANewLine = true;
        token.eol() = true;
    } else if (isdigit(c)) { // a integer?
        // put the digit back into the input stream so
        // we read the entire number in a function
        inStream.putback(c);
        token.setWholeNumber(readInteger());
        //parsingANewLine = false;
    } else if (c == '>') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '<') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '!') {
        inStream.putback(c);
        token.setOp(readRelOp());
    } else if (c == '=') {
        if (inStream.peek() == '=') {
            inStream.putback(c);
            token.setOp(readRelOp());

        } else token.symbol(c);
    } else if (c == '"') {
        std::string str;
        while (inStream.peek() != '"') {
            inStream.get(c);
            str += c;
        }
        inStream.get(c);
        token.setString(str);

    } else if ((c == '/') && (inStream.peek() == '/')) {
        std::string str;
        str += c;
        inStream.get(c);
        str += c;
        token.setOp(str);
    } else if (c == '+' || c == '-' || c == '*' || c == '/' || c == '%') token.symbol(c);
    else if (c == ';') token.symbol(c);
    else if (c == ':') token.symbol(c);
    else if (c == '(' || c == ')') token.symbol(c);
    else if (c == '{' || c == '}') token.symbol(c);
    else if (c == '[' || c == ']') token.symbol(c);
    else if (c == ',') token.symbol(c);
    else if (c == '.') token.symbol(c);
    else if (isalpha(c)) {  // an identifier?
        // put c back into the stream so we can read the entire name in a function.
        inStream.putback(c);
        token.setName(readName());
        //parsingANewLine = false;
    } else {
        std::cout << "Unknown character in input. ->" << c << "<-" << std::endl;
        exit(1);
    }
    parsingANewLine = token.eol() || token.isDedent();


    _tokens.push_back(token);
    return lastToken = token;
}